

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O2

void __thiscall
World_3df::save_elite(World_3df *this,shared_ptr<Population> *src,shared_ptr<Population> *dst)

{
  type pPVar1;
  creatfitdict_t *__x;
  creat_t *__x_00;
  type pFVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var3;
  type pCVar4;
  type pCVar5;
  type pCVar6;
  type pCVar7;
  ulong uVar8;
  pointer __src;
  long lVar9;
  long val;
  double dVar10;
  string local_280;
  Msg local_260;
  Msg local_230;
  Msg local_200;
  Msg local_1d0;
  Msg local_1a0;
  Msg local_170;
  string local_140;
  string local_120;
  Msg local_100;
  Msg local_d0;
  ulong local_a0;
  long local_98;
  shared_ptr<Population> *local_90;
  shared_ptr<Population> *local_88;
  shared_ptr<util::logging::File_logger> local_80;
  undefined1 local_70 [8];
  creatfitdict_t tmp;
  creat_t tmps;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  
  local_88 = dst;
  pPVar1 = boost::shared_ptr<Population>::operator->(src);
  __x = Population::get_creatures_fdict(pPVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_70,__x);
  local_90 = src;
  pPVar1 = boost::shared_ptr<Population>::operator->(src);
  __x_00 = Population::get_creatures(pPVar1);
  std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::vector
            ((vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_> *)
             &tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__x_00);
  local_d0._vptr_Msg = (_func_int **)(this->super_World).LOGFILE.px;
  local_d0.msg_txt._M_dataplus._M_p = (pointer)(this->super_World).LOGFILE.pn.pi_;
  if ((sp_counted_base *)local_d0.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_d0.msg_txt._M_dataplus._M_p)->use_count_ =
         ((sp_counted_base *)local_d0.msg_txt._M_dataplus._M_p)->use_count_ + 1;
    UNLOCK();
  }
  pFVar2 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)&local_d0);
  util::logging::Msg::Msg(&local_100,anon_var_dwarf_33f07,L_NORM);
  (*(pFVar2->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar2,&local_100);
  util::logging::Msg::~Msg(&local_100);
  boost::detail::shared_count::~shared_count((shared_count *)&local_d0.msg_txt);
  uVar8 = 0;
  while( true ) {
    pPVar1 = boost::shared_ptr<Population>::operator->(local_90);
    if (pPVar1->ELITE_SIZE <= uVar8) break;
    _Var3 = std::
            __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_70,tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
    lVar9 = (long)_Var3._M_current - (long)local_70;
    local_80.px = (this->super_World).LOGFILE.px;
    local_80.pn.pi_ = (this->super_World).LOGFILE.pn.pi_;
    if (local_80.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_80.pn.pi_)->use_count_ = (local_80.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_a0 = uVar8;
    pFVar2 = boost::shared_ptr<util::logging::File_logger>::operator*(&local_80);
    util::logging::Msg::Msg(&local_170,"...Zachowano stwora z pozycji [",L_NORM);
    val = lVar9 >> 3;
    local_98 = lVar9;
    util::logging::Msg::operator+(&local_1a0,&local_170,val);
    std::__cxx11::string::string((string *)&local_140,"]: x1 = ",&local_33);
    util::logging::Msg::operator+(&local_1d0,&local_1a0,&local_140);
    pCVar4 = boost::shared_ptr<Creature>::operator->
                       ((shared_ptr<Creature> *)
                        (tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + val * 2));
    dVar10 = Creature::get_phenotype(pCVar4,0,0,0);
    util::logging::Msg::operator+(&local_200,&local_1d0,dVar10);
    std::__cxx11::string::string((string *)&local_120,"; x2 = ",&local_32);
    util::logging::Msg::operator+(&local_230,&local_200,&local_120);
    pCVar4 = boost::shared_ptr<Creature>::operator->
                       ((shared_ptr<Creature> *)
                        (tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + val * 2));
    pCVar5 = boost::shared_ptr<Creature>::operator->
                       ((shared_ptr<Creature> *)
                        (tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + val * 2));
    pCVar6 = boost::shared_ptr<Chromosome>::operator->
                       ((pCVar5->chroms).
                        super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    dVar10 = Creature::get_phenotype(pCVar4,0,0,pCVar6->ALLELE_SIZE);
    util::logging::Msg::operator+(&local_260,&local_230,dVar10);
    std::__cxx11::string::string((string *)&local_280,"; fitness: ",&local_31);
    util::logging::Msg::operator+(&local_d0,&local_260,&local_280);
    pCVar4 = boost::shared_ptr<Creature>::operator->
                       ((shared_ptr<Creature> *)
                        (tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + val * 2));
    util::logging::Msg::operator+(&local_100,&local_d0,pCVar4->fitness);
    (*(pFVar2->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar2,&local_100);
    util::logging::Msg::~Msg(&local_100);
    util::logging::Msg::~Msg(&local_d0);
    std::__cxx11::string::~string((string *)&local_280);
    util::logging::Msg::~Msg(&local_260);
    util::logging::Msg::~Msg(&local_230);
    std::__cxx11::string::~string((string *)&local_120);
    util::logging::Msg::~Msg(&local_200);
    util::logging::Msg::~Msg(&local_1d0);
    std::__cxx11::string::~string((string *)&local_140);
    util::logging::Msg::~Msg(&local_1a0);
    util::logging::Msg::~Msg(&local_170);
    boost::detail::shared_count::~shared_count(&local_80.pn);
    pCVar4 = boost::shared_ptr<Creature>::operator->
                       ((shared_ptr<Creature> *)
                        (tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + val * 2));
    Creature::set_elite(pCVar4,true);
    pPVar1 = boost::shared_ptr<Population>::operator->(local_88);
    pCVar7 = boost::shared_ptr<Creature>::operator*
                       ((shared_ptr<Creature> *)
                        (tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + val * 2));
    (*pPVar1->_vptr_Population[2])(pPVar1,pCVar7);
    std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::erase
              ((vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_> *
               )&tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
               (shared_ptr<Creature> *)
               (tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + val * 2));
    uVar8 = local_a0;
    __src = (pointer)((long)local_70 + local_98 + 8);
    if (__src != tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start) {
      memmove((void *)((long)local_70 + local_98),__src,
              (long)tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start - (long)__src);
    }
    tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start + -1;
    uVar8 = uVar8 + 1;
  }
  local_d0._vptr_Msg = (_func_int **)(this->super_World).LOGFILE.px;
  local_d0.msg_txt._M_dataplus._M_p = (pointer)(this->super_World).LOGFILE.pn.pi_;
  if ((sp_counted_base *)local_d0.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_d0.msg_txt._M_dataplus._M_p)->use_count_ =
         ((sp_counted_base *)local_d0.msg_txt._M_dataplus._M_p)->use_count_ + 1;
    UNLOCK();
  }
  pFVar2 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)&local_d0);
  util::logging::Msg::Msg(&local_100,anon_var_dwarf_33f1d,L_NORM);
  (*(pFVar2->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar2,&local_100);
  util::logging::Msg::~Msg(&local_100);
  boost::detail::shared_count::~shared_count((shared_count *)&local_d0.msg_txt);
  std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::~vector
            ((vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_> *)
             &tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)local_70);
  return;
}

Assistant:

void World_3df::save_elite( shared_ptr<Population>& src, boost::shared_ptr<Population>& dst )
{
	Population::creatfitdict_t tmp(src->get_creatures_fdict());
	Population::creat_t tmps(src->get_creatures());

	(*get_log()) << "Zachowuję elity...";

	for(size_t i = 0; i < src->ELITE_SIZE; ++i)
	{
		Population::creatfitdict_t::iterator mxit = max_element(tmp.begin(), tmp.end());
		size_t dist = std::distance(tmp.begin(), mxit);

		(*get_log()) << util::logging::Msg("...Zachowano stwora z pozycji [") + static_cast<long long> (dist)
				+ "]: x1 = " + tmps[dist]->get_phenotype(0, 0, 0) + "; x2 = " + tmps[dist]->get_phenotype(0, 0,
				tmps[dist]->get_chroms()[0]->ALLELE_SIZE) + "; fitness: " + tmps[dist]-> get_fitness();

		tmps[dist]->set_elite(true);
		dst->add_creature(*tmps[dist]);

		tmps.erase(tmps.begin() + dist);
		tmp.erase(tmp.begin() + dist);
	}

	(*get_log()) << "Już";
}